

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

DbPage * sqlite3PagerLookup(Pager *pPager,Pgno pgno)

{
  sqlite3_pcache_page *pPage_00;
  PgHdr *pPVar1;
  Pgno in_ESI;
  PCache *in_RDI;
  sqlite3_pcache_page *pPage;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pPage_00 = sqlite3PcacheFetch((PCache *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                (Pgno)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                                (int)in_stack_ffffffffffffffe8);
  pPVar1 = sqlite3PcacheFetchFinish(in_RDI,in_ESI,pPage_00);
  return pPVar1;
}

Assistant:

SQLITE_PRIVATE DbPage *sqlite3PagerLookup(Pager *pPager, Pgno pgno){
  sqlite3_pcache_page *pPage;
  assert( pPager!=0 );
  assert( pgno!=0 );
  assert( pPager->pPCache!=0 );
  pPage = sqlite3PcacheFetch(pPager->pPCache, pgno, 0);
  assert( pPage==0 || pPager->hasBeenUsed );
  return sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pPage);
}